

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceputils.c
# Opt level: O3

int init_scep(void)

{
  uchar randpool [1024];
  undefined1 auStack_408 [1032];
  
  log_set_level(2);
  RAND_seed(auStack_408,0x400);
  nid_messageType = OBJ_create("2.16.840.1.113733.1.9.2","messageType","messageType");
  if ((((nid_messageType != 0) &&
       (nid_pkiStatus = OBJ_create("2.16.840.1.113733.1.9.3","pkiStatus","pkiStatus"),
       nid_pkiStatus != 0)) &&
      (nid_failInfo = OBJ_create("2.16.840.1.113733.1.9.4","failInfo","failInfo"), nid_failInfo != 0
      )) && (((nid_senderNonce = OBJ_create("2.16.840.1.113733.1.9.5","senderNonce","senderNonce"),
              nid_senderNonce != 0 &&
              (nid_recipientNonce =
                    OBJ_create("2.16.840.1.113733.1.9.6","recipientNonce","recipientNonce"),
              nid_recipientNonce != 0)) &&
             ((nid_transId = OBJ_create("2.16.840.1.113733.1.9.7","transId","transId"),
              nid_transId != 0 &&
              (nid_extensionReq =
                    OBJ_create("2.16.840.1.113733.1.9.8","extensionReq","extensionReq"),
              nid_extensionReq != 0)))))) {
    return 0;
  }
  log_log(4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/sceputils.c"
          ,0xcb,"cannot create OID");
  return 1;
}

Assistant:

int init_scep() {
    unsigned char   randpool[1024];

    // set default log level
    log_set_level(LOG_INFO);

    // Add algorithms and init random pool
    RAND_seed(randpool, sizeof(randpool));

    // Create OpenSSL NIDs
    nid_messageType = OBJ_create("2.16.840.1.113733.1.9.2", "messageType", "messageType");
    if (nid_messageType == 0) {
        goto err;
    }
    nid_pkiStatus = OBJ_create("2.16.840.1.113733.1.9.3", "pkiStatus", "pkiStatus");
    if (nid_pkiStatus == 0) {
        goto err;
    }
    nid_failInfo = OBJ_create("2.16.840.1.113733.1.9.4", "failInfo", "failInfo");
    if (nid_failInfo == 0) {
        goto err;
    }
    nid_senderNonce = OBJ_create("2.16.840.1.113733.1.9.5", "senderNonce", "senderNonce");
    if (nid_senderNonce == 0) {
        goto err;
    }
    nid_recipientNonce = OBJ_create("2.16.840.1.113733.1.9.6", "recipientNonce", "recipientNonce");
    if (nid_recipientNonce == 0) {
        goto err;
    }
    nid_transId = OBJ_create("2.16.840.1.113733.1.9.7", "transId", "transId");
    if (nid_transId == 0) {
        goto err;
    }
    nid_extensionReq = OBJ_create("2.16.840.1.113733.1.9.8", "extensionReq", "extensionReq");
    if (nid_extensionReq == 0) {
        goto err;
    }
    return (0);

err:
    log_error("cannot create OID");
    return (1);
}